

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::operator<<(QDataStream *this,char *s)

{
  size_t sVar1;
  QDataStream *this_00;
  long in_RSI;
  QDataStream *in_RDI;
  qint64 len;
  
  if (in_RSI == 0) {
    this_00 = (QDataStream *)0x0;
  }
  else {
    sVar1 = qstrlen((char *)in_RDI);
    this_00 = (QDataStream *)(sVar1 + 1);
  }
  writeBytes(this_00,(char *)in_RDI,(qint64)this_00);
  return in_RDI;
}

Assistant:

QDataStream &QDataStream::operator<<(const char *s)
{
    // Include null terminator, unless s itself is null
    const qint64 len = s ? qint64(qstrlen(s)) + 1 : 0;
    writeBytes(s, len);
    return *this;
}